

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpComms.cpp
# Opt level: O2

void __thiscall helics::udp::UdpComms::UdpComms(UdpComms *this)

{
  __basic_future<int> _Stack_28;
  
  NetworkCommsInterface::NetworkCommsInterface(&this->super_NetworkCommsInterface,UDP,dual);
  (this->super_NetworkCommsInterface).super_CommsInterface._vptr_CommsInterface =
       (_func_int **)&PTR__UdpComms_0044fde0;
  std::promise<int>::promise(&this->promisePort);
  (this->futurePort).super___basic_future<int>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->futurePort).super___basic_future<int>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__basic_future<int>::__basic_future(&_Stack_28,&(this->promisePort)._M_future);
  std::future<int>::operator=(&this->futurePort,(future<int> *)&_Stack_28);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&_Stack_28._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

UdpComms::UdpComms(): NetworkCommsInterface(gmlc::networking::InterfaceTypes::UDP)
{
    futurePort = promisePort.get_future();
}